

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sysbvm_gc_performCycle(sysbvm_context_t *context)

{
  sysbvm_context_t *context_local;
  
  sysbvm_gc_iterateRoots(context,context,sysbvm_gc_markPointer);
  sysbvm_gc_markUntilStackIsEmpty(context);
  sysbvm_heap_replaceWeakReferencesWithTombstones(&context->heap);
  sysbvm_heap_sweep(&context->heap);
  sysbvm_heap_swapGCColors(&context->heap);
  return;
}

Assistant:

static void sysbvm_gc_performCycle(sysbvm_context_t *context)
{
    // Phase 1: marking phase
    sysbvm_gc_iterateRoots(context, context, sysbvm_gc_markPointer);
    sysbvm_gc_markUntilStackIsEmpty(context);

    // Phase 2: Replace the weak references with their tombstones.
    sysbvm_heap_replaceWeakReferencesWithTombstones(&context->heap);

    // Phase 3: Sweep
    sysbvm_heap_sweep(&context->heap);

    // Phase 4: Swap the GC colors.
    sysbvm_heap_swapGCColors(&context->heap);
}